

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterTests.cpp
# Opt level: O0

int testEpochsOutOfAllowedSet(void)

{
  NeuralNetwork *nn_00;
  ostream *poVar1;
  pair<std::_Rb_tree_const_iterator<long>,_bool> pVar2;
  undefined1 local_170 [8];
  Result res;
  set<long,_std::less<long>,_std::allocator<long>_> local_118;
  _Base_ptr local_e8;
  undefined1 local_e0;
  value_type_conflict1 local_d8;
  _Base_ptr local_d0;
  undefined1 local_c8;
  value_type_conflict1 local_c0;
  _Base_ptr local_b8;
  undefined1 local_b0;
  value_type_conflict1 local_a8;
  _Base_ptr local_a0;
  undefined1 local_98;
  value_type_conflict1 local_90;
  undefined1 auStack_88 [8];
  set<long,_std::less<long>,_std::allocator<long>_> allowedValues;
  NeuralNetwork *nn;
  Model m;
  
  CoreML::Specification::Model::Model((Model *)&nn);
  nn_00 = buildBasicUpdatableNeuralNetworkModel((Model *)&nn);
  allowedValues._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  allowedValues._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  allowedValues._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  allowedValues._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  allowedValues._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  auStack_88 = (undefined1  [8])0x0;
  allowedValues._M_t._M_impl._0_8_ = 0;
  std::set<long,_std::less<long>,_std::allocator<long>_>::set
            ((set<long,_std::less<long>,_std::allocator<long>_> *)auStack_88);
  local_90 = 10;
  pVar2 = std::set<long,_std::less<long>,_std::allocator<long>_>::insert
                    ((set<long,_std::less<long>,_std::allocator<long>_> *)auStack_88,&local_90);
  local_a0 = (_Base_ptr)pVar2.first._M_node;
  local_98 = pVar2.second;
  local_a8 = 0x14;
  pVar2 = std::set<long,_std::less<long>,_std::allocator<long>_>::insert
                    ((set<long,_std::less<long>,_std::allocator<long>_> *)auStack_88,&local_a8);
  local_b8 = (_Base_ptr)pVar2.first._M_node;
  local_b0 = pVar2.second;
  local_c0 = 0x1e;
  pVar2 = std::set<long,_std::less<long>,_std::allocator<long>_>::insert
                    ((set<long,_std::less<long>,_std::allocator<long>_> *)auStack_88,&local_c0);
  local_d0 = (_Base_ptr)pVar2.first._M_node;
  local_c8 = pVar2.second;
  local_d8 = 0x28;
  pVar2 = std::set<long,_std::less<long>,_std::allocator<long>_>::insert
                    ((set<long,_std::less<long>,_std::allocator<long>_> *)auStack_88,&local_d8);
  local_e8 = (_Base_ptr)pVar2.first._M_node;
  local_e0 = pVar2.second;
  addLearningRate<CoreML::Specification::NeuralNetwork>
            (nn_00,kSgdOptimizer,0.699999988079071,0.0,1.0);
  local_118._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  local_118._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_118._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_118._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  local_118._M_t._M_impl._0_8_ = 0;
  local_118._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_118._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  std::set<long,_std::less<long>,_std::allocator<long>_>::set(&local_118);
  addMiniBatchSize<CoreML::Specification::NeuralNetwork>(nn_00,kSgdOptimizer,0x14,10,100,&local_118)
  ;
  std::set<long,_std::less<long>,_std::allocator<long>_>::~set(&local_118);
  std::set<long,_std::less<long>,_std::allocator<long>_>::set
            ((set<long,_std::less<long>,_std::allocator<long>_> *)
             &res.m_message.super__Rb_tree_node_base._M_right,
             (set<long,_std::less<long>,_std::allocator<long>_> *)auStack_88);
  addEpochs<CoreML::Specification::NeuralNetwork>
            (nn_00,100,0,0,
             (set<long,_std::less<long>,_std::allocator<long>_> *)
             &res.m_message.super__Rb_tree_node_base._M_right);
  std::set<long,_std::less<long>,_std::allocator<long>_>::~set
            ((set<long,_std::less<long>,_std::allocator<long>_> *)
             &res.m_message.super__Rb_tree_node_base._M_right);
  CoreML::Model::validate((Result *)local_170,(Model *)&nn);
  m._oneof_case_[0]._0_1_ = CoreML::Result::good((Result *)local_170);
  if (m._oneof_case_[0]._0_1_) {
    poVar1 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/ParameterTests.cpp"
                            );
    poVar1 = std::operator<<(poVar1,":");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,0x1a1);
    poVar1 = std::operator<<(poVar1,": error: ");
    poVar1 = std::operator<<(poVar1,"!((res).good())");
    poVar1 = std::operator<<(poVar1," was false, expected true.");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  m._oneof_case_[0]._1_3_ = 0;
  CoreML::Result::~Result((Result *)local_170);
  std::set<long,_std::less<long>,_std::allocator<long>_>::~set
            ((set<long,_std::less<long>,_std::allocator<long>_> *)auStack_88);
  CoreML::Specification::Model::~Model((Model *)&nn);
  return m._oneof_case_[0];
}

Assistant:

int testEpochsOutOfAllowedSet() {
    
    Specification::Model m;
    
    // basic neural network model without any updatable model parameters.
    auto nn = buildBasicUpdatableNeuralNetworkModel(m);
    
    std::set<int64_t> allowedValues = std::set<int64_t>();
    allowedValues.insert(10);
    allowedValues.insert(20);
    allowedValues.insert(30);
    allowedValues.insert(40);
    
    addLearningRate(nn, Specification::Optimizer::kSgdOptimizer, 0.7f, 0.0f, 1.0f);
    addMiniBatchSize(nn, Specification::Optimizer::kSgdOptimizer, 20, 10, 100);
    addEpochs(nn, 100, 0, 0, allowedValues);
    
    // expect validation to fail due to conflict in updatable model parameter names.
    Result res = Model::validate(m);
    ML_ASSERT_BAD(res);
    return 0;
}